

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lss_allocator.cc
# Opt level: O2

void * __thiscall
FASTER::core::lss_memory::ThreadAllocator::AllocateAligned
          (ThreadAllocator *this,uint32_t size,uint32_t alignment)

{
  uint32_t uVar1;
  SegmentAllocator *pSVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  char *__assertion;
  
  uVar4 = alignment - (alignment >> 1 & 0x55555555);
  uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333);
  uVar5 = size + alignment + 1;
  if (this->segment_allocator_ != (SegmentAllocator *)0x0) goto LAB_001036bb;
  while( true ) {
    pSVar2 = (SegmentAllocator *)aligned_alloc(0x40,0x1f50);
    this->segment_allocator_ = pSVar2;
    if (pSVar2 == (SegmentAllocator *)0x0) {
      return (void *)0x0;
    }
    (pSVar2->state).field_0 = (anon_union_8_2_79a71db5_for_SegmentState_0)0x0;
LAB_001036bb:
    if (alignment < 0x10) break;
    if (1 < ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
      __assertion = "(alignment & (alignment - 1)) == 0";
      uVar4 = 0x6a;
      goto LAB_0010378f;
    }
    uVar1 = Reserve(this,uVar5 & 0xfffffff0);
    pSVar2 = this->segment_allocator_;
    if (this->segment_offset_ < 0x1f41) {
      sVar3 = pad_alignment((size_t)(pSVar2->buffer + (ulong)uVar1 + 2),(ulong)alignment);
      uVar4 = ((int)sVar3 - ((int)pSVar2 + uVar1 + 0xe)) - 2;
      if ((ulong)size + (ulong)uVar4 + 2 <= (ulong)(uVar5 & 0xfffffff0)) {
        uVar4 = uVar4 + uVar1;
        *(short *)(pSVar2->buffer + uVar4) = (short)uVar4;
        return pSVar2->buffer + uVar4 + 2;
      }
      __assertion = "user_offset + sizeof(Header) + size <= block_size";
      uVar4 = 0x7c;
      goto LAB_0010378f;
    }
    SegmentAllocator::Seal(pSVar2,this->allocations_);
    this->segment_allocator_ = (SegmentAllocator *)0x0;
    this->segment_offset_ = 0;
    this->allocations_ = 0;
  }
  __assertion = "alignment >= kBaseAlignment";
  uVar4 = 0x69;
LAB_0010378f:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/huangjiahua[P]neatlib/epoch/faster/lss_allocator.cc"
                ,uVar4,
                "void *FASTER::core::lss_memory::ThreadAllocator::AllocateAligned(uint32_t, uint32_t)"
               );
}

Assistant:

void* ThreadAllocator::AllocateAligned(uint32_t size, uint32_t alignment) {
  if(!segment_allocator_) {
    segment_allocator_ = reinterpret_cast<SegmentAllocator*>(aligned_alloc(kCacheLineSize,
                         sizeof(SegmentAllocator)));
    if(!segment_allocator_) {
      return nullptr;
    }
    new(segment_allocator_) SegmentAllocator{};
  }
  // Alignment must be >= base alignment, and a power of 2.
  assert(alignment >= kBaseAlignment);
  assert((alignment & (alignment - 1)) == 0);
  // Block needs to be large enough to hold the user block, the header, and the align land fill.
  // Max align land fill size is (alignment - kBaseAlignment).
  uint32_t block_size = static_cast<uint32_t>(pad_alignment(
                          size + sizeof(Header) + alignment - kBaseAlignment,
                          kBaseAlignment));
  uint32_t block_offset = Reserve(block_size);
  if(segment_offset_ <= kSegmentSize) {
    // The allocation succeeded inside the active segment.
    uint8_t* buffer = segment_allocator_->buffer;
#ifdef _DEBUG
    //  - 0xEA - align land fill.
    ::memset(&buffer[block_offset], 0xEA, block_size);
#endif
    // Align the user block.
    uint32_t user_offset = static_cast<uint32_t>(pad_alignment(reinterpret_cast<size_t>(
                             &buffer[block_offset]) + sizeof(Header), alignment) -
                           reinterpret_cast<size_t>(&buffer[block_offset]) - sizeof(Header));
    assert(user_offset + sizeof(Header) + size <= block_size);
    uint32_t offset = block_offset + user_offset;
#ifdef _DEBUG
    //  - 0xCA - allocated.
    ::memset(&buffer[offset], 0xCA, size + sizeof(Header));
#endif
    Header* header = reinterpret_cast<Header*>(&buffer[offset]);
#ifdef _DEBUG
    new(header) Header(size, offset);
#else
    new(header) Header(offset);
#endif
    return header + 1;
  } else {
    // We filled the active segment; seal it.
    segment_allocator_->Seal(allocations_);
    segment_allocator_ = nullptr;
    allocations_ = 0;
    segment_offset_ = 0;
    // Call self recursively, to allocate inside a new segment.
    return AllocateAligned(size, alignment);
  }
}